

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_panner_config ma_panner_config_init(ma_format format,ma_uint32 channels)

{
  ma_panner_config mVar1;
  undefined4 in_ESI;
  undefined4 in_EDI;
  ma_panner_config config;
  undefined1 local_20 [16];
  undefined8 local_10;
  undefined1 *local_8;
  
  local_8 = local_20;
  local_10 = 0x10;
  if (local_8 != (undefined1 *)0x0) {
    memset(local_8,0,0x10);
  }
  mVar1.channels = in_ESI;
  mVar1.format = in_EDI;
  mVar1.mode = ma_pan_mode_balance;
  mVar1.pan = 0.0;
  return mVar1;
}

Assistant:

MA_API ma_panner_config ma_panner_config_init(ma_format format, ma_uint32 channels)
{
    ma_panner_config config;

    MA_ZERO_OBJECT(&config);
    config.format   = format;
    config.channels = channels;
    config.mode     = ma_pan_mode_balance;  /* Set to balancing mode by default because it's consistent with other audio engines and most likely what the caller is expecting. */
    config.pan      = 0;

    return config;
}